

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O0

void CSOAA::predict_or_learn<false>(csoaa *c,single_learner *base,example *ec)

{
  wclass *pwVar1;
  float *pfVar2;
  size_t sVar3;
  wclass **ppwVar4;
  float *pfVar5;
  long in_RDX;
  uint *in_RDI;
  float margin;
  float val;
  size_t i_1;
  float second_best_cost;
  uint64_t second_best;
  uint32_t i;
  wclass *cl;
  wclass *__end3;
  wclass *__begin3;
  v_array<COST_SENSITIVE::wclass> *__range3;
  size_t pt_start;
  float score;
  uint32_t prediction;
  label ld;
  float *in_stack_ffffffffffffff48;
  float x;
  float *score_00;
  undefined4 in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  polyprediction *in_stack_ffffffffffffff60;
  example *peVar6;
  example *ec_00;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  float fVar7;
  single_learner *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  uint uVar8;
  wclass *local_68;
  uint local_3c;
  v_array<COST_SENSITIVE::wclass> local_38;
  long local_18;
  uint *local_8;
  
  local_38._begin = *(wclass **)(in_RDX + 0x6828);
  local_38._end = *(wclass **)(in_RDX + 0x6830);
  local_38.end_array = *(wclass **)(in_RDX + 0x6838);
  local_38.erase_count = *(size_t *)(in_RDX + 0x6840);
  local_3c = 1;
  local_18 = in_RDX;
  local_8 = in_RDI;
  if (*(long *)(in_RDX + 0x68c0) == 0) {
    pfVar2 = (float *)0x0;
  }
  else {
    pfVar2 = (float *)features::size((features *)0x43288f);
  }
  *(undefined8 *)(local_18 + 0x6828) = 0;
  *(undefined4 *)(local_18 + 0x6830) = 0;
  score_00 = pfVar2;
  sVar3 = v_array<COST_SENSITIVE::wclass>::size(&local_38);
  if (sVar3 == 0) {
    *(undefined8 *)(local_18 + 0x6828) = 0x7f7fffff;
    *(undefined4 *)(local_18 + 0x6830) = 0;
    LEARNER::learner<char,_example>::multipredict
              ((learner<char,_example> *)0x0,
               (example *)CONCAT44(0x7f7fffff,in_stack_ffffffffffffff78),
               (size_t)in_stack_ffffffffffffff70,
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               in_stack_ffffffffffffff60,SUB41((uint)in_stack_ffffffffffffff5c >> 0x18,0));
    for (uVar8 = 1; uVar8 <= *local_8; uVar8 = uVar8 + 1) {
      add_passthrough_feature_magic
                ((example *)&in_stack_ffffffffffffff60->scalars,
                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),(uint64_t)score_00,
                 (float)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      if (*(float *)(*(long *)(local_8 + 2) + (ulong)(uVar8 - 1) * 0x20) <
          *(float *)(*(long *)(local_8 + 2) + (ulong)(local_3c - 1) * 0x20)) {
        local_3c = uVar8;
      }
    }
    *(undefined4 *)(local_18 + 0x68a8) =
         *(undefined4 *)(*(long *)(local_8 + 2) + (ulong)(local_3c - 1) * 0x20);
  }
  else {
    ppwVar4 = v_array<COST_SENSITIVE::wclass>::begin(&local_38);
    local_68 = *ppwVar4;
    ppwVar4 = v_array<COST_SENSITIVE::wclass>::end(&local_38);
    pwVar1 = *ppwVar4;
    for (; local_68 != pwVar1; local_68 = local_68 + 1) {
      inner_loop<false>(in_stack_ffffffffffffff70,
                        (example *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                        (uint32_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                        SUB84(in_stack_ffffffffffffff60,0),
                        (uint32_t *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                        score_00,in_stack_ffffffffffffff48);
    }
    *(undefined4 *)(local_18 + 0x68a8) = 0x7f7fffff;
  }
  if (*(long *)(local_18 + 0x68c0) != 0) {
    fVar7 = 3.4028235e+38;
    peVar6 = (example *)0x0;
    while (ec_00 = peVar6, sVar3 = features::size((features *)0x432b75),
          peVar6 < (example *)(sVar3 - (long)pfVar2)) {
      pfVar5 = v_array<float>::operator[]
                         (*(v_array<float> **)(local_18 + 0x68c0),(long)pfVar2 + (long)ec_00);
      in_stack_ffffffffffffff5c = *pfVar5;
      if ((*(float *)(local_18 + 0x68a8) <= in_stack_ffffffffffffff5c &&
           in_stack_ffffffffffffff5c != *(float *)(local_18 + 0x68a8)) &&
         (in_stack_ffffffffffffff5c < fVar7)) {
        fVar7 = in_stack_ffffffffffffff5c;
        v_array<unsigned_long>::operator[]
                  ((v_array<unsigned_long> *)(*(long *)(local_18 + 0x68c0) + 0x20),
                   (long)pfVar2 + (long)ec_00);
      }
      peVar6 = (example *)((long)&(ec_00->super_example_predict).indices._begin + 1);
    }
    x = (float)((ulong)peVar6 >> 0x20);
    if (3.4028235e+38 <= fVar7) {
      add_passthrough_feature_magic
                (ec_00,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 (uint64_t)score_00,x);
    }
    else {
      fVar7 = fVar7 - *(float *)(local_18 + 0x68a8);
      add_passthrough_feature_magic
                (ec_00,CONCAT44(in_stack_ffffffffffffff5c,fVar7),(uint64_t)score_00,x);
      add_passthrough_feature_magic
                (ec_00,CONCAT44(in_stack_ffffffffffffff5c,fVar7),(uint64_t)score_00,
                 (float)((ulong)peVar6 >> 0x20));
    }
  }
  *(uint *)(local_18 + 0x6850) = local_3c;
  *(wclass **)(local_18 + 0x6828) = local_38._begin;
  *(wclass **)(local_18 + 0x6830) = local_38._end;
  *(wclass **)(local_18 + 0x6838) = local_38.end_array;
  *(size_t *)(local_18 + 0x6840) = local_38.erase_count;
  return;
}

Assistant:

void predict_or_learn(csoaa& c, single_learner& base, example& ec)
{
  // cerr << "------------- passthrough" << endl;
  COST_SENSITIVE::label ld = ec.l.cs;
  uint32_t prediction = 1;
  float score = FLT_MAX;
  size_t pt_start = ec.passthrough ? ec.passthrough->size() : 0;
  ec.l.simple = {0., 0., 0.};
  if (ld.costs.size() > 0)
  {
    for (auto& cl : ld.costs)
      inner_loop<is_learn>(base, ec, cl.class_index, cl.x, prediction, score, cl.partial_prediction);
    ec.partial_prediction = score;
  }
  else if (DO_MULTIPREDICT && !is_learn)
  {
    ec.l.simple = {FLT_MAX, 0.f, 0.f};
    base.multipredict(ec, 0, c.num_classes, c.pred, false);
    for (uint32_t i = 1; i <= c.num_classes; i++)
    {
      add_passthrough_feature(ec, i, c.pred[i - 1].scalar);
      if (c.pred[i - 1].scalar < c.pred[prediction - 1].scalar)
        prediction = i;
    }
    ec.partial_prediction = c.pred[prediction - 1].scalar;
  }
  else
  {
    float temp;
    for (uint32_t i = 1; i <= c.num_classes; i++) inner_loop<false>(base, ec, i, FLT_MAX, prediction, score, temp);
  }
  if (ec.passthrough)
  {
    uint64_t second_best = 0;
    float second_best_cost = FLT_MAX;
    for (size_t i = 0; i < ec.passthrough->size() - pt_start; i++)
    {
      float val = ec.passthrough->values[pt_start + i];
      if ((val > ec.partial_prediction) && (val < second_best_cost))
      {
        second_best_cost = val;
        second_best = ec.passthrough->indicies[pt_start + i];
      }
    }
    if (second_best_cost < FLT_MAX)
    {
      float margin = second_best_cost - ec.partial_prediction;
      add_passthrough_feature(ec, constant * 2, margin);
      add_passthrough_feature(ec, constant * 2 + 1 + second_best, 1.);
    }
    else
      add_passthrough_feature(ec, constant * 3, 1.);
  }

  ec.pred.multiclass = prediction;
  ec.l.cs = ld;
}